

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O2

int __thiscall ncnn::ConvolutionDepthWise::load_model(ConvolutionDepthWise *this,ModelBin *mb)

{
  undefined4 uVar1;
  Allocator *pAVar2;
  void *pvVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  size_t sVar13;
  Mat local_198;
  Mat *local_150;
  Mat local_148;
  Mat local_100;
  Mat local_b8;
  Option opt_q;
  
  if (this->dynamic_weight != 0) {
    return 0;
  }
  (*mb->_vptr_ModelBin[2])(&local_198,mb,(ulong)(uint)this->weight_data_size,0);
  local_150 = &this->weight_data;
  piVar8 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
  if (local_150 != &local_198) {
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + 1;
      UNLOCK();
    }
    piVar8 = (this->weight_data).refcount;
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        pAVar2 = (this->weight_data).allocator;
        if (pAVar2 == (Allocator *)0x0) {
          free((this->weight_data).data);
        }
        else {
          (*pAVar2->_vptr_Allocator[3])();
        }
      }
    }
    (this->weight_data).data = local_198.data;
    piVar8 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
    (this->weight_data).refcount = piVar8;
    (this->weight_data).elemsize = CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize)
    ;
    (this->weight_data).elempack = local_198.elempack;
    (this->weight_data).allocator = local_198.allocator;
    (this->weight_data).dims = local_198.dims;
    (this->weight_data).w = local_198.w;
    (this->weight_data).h = local_198.h;
    (this->weight_data).d = local_198.d;
    (this->weight_data).c = local_198.c;
    (this->weight_data).cstep = local_198.cstep;
  }
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_198.allocator == (Allocator *)0x0) {
        free(local_198.data);
      }
      else {
        (*(local_198.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (local_150->data == (void *)0x0) {
    return -100;
  }
  if ((long)(this->weight_data).c * (this->weight_data).cstep == 0) {
    return -100;
  }
  if (this->bias_term != 0) {
    (*mb->_vptr_ModelBin[2])(&local_198,mb,(ulong)(uint)this->num_output);
    piVar8 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
    if (&this->bias_data != &local_198) {
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + 1;
        UNLOCK();
      }
      piVar8 = (this->bias_data).refcount;
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          pAVar2 = (this->bias_data).allocator;
          if (pAVar2 == (Allocator *)0x0) {
            free((this->bias_data).data);
          }
          else {
            (*pAVar2->_vptr_Allocator[3])();
          }
        }
      }
      (this->bias_data).data = local_198.data;
      piVar8 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
      (this->bias_data).refcount = piVar8;
      (this->bias_data).elemsize = CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize)
      ;
      (this->bias_data).elempack = local_198.elempack;
      (this->bias_data).allocator = local_198.allocator;
      (this->bias_data).dims = local_198.dims;
      (this->bias_data).w = local_198.w;
      (this->bias_data).h = local_198.h;
      (this->bias_data).d = local_198.d;
      (this->bias_data).c = local_198.c;
      (this->bias_data).cstep = local_198.cstep;
    }
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        if (local_198.allocator == (Allocator *)0x0) {
          free(local_198.data);
        }
        else {
          (*(local_198.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if ((this->bias_data).data == (void *)0x0) {
      return -100;
    }
    if ((long)(this->bias_data).c * (this->bias_data).cstep == 0) {
      return -100;
    }
  }
  iVar6 = this->int8_scale_term;
  if (iVar6 == 1) {
LAB_00397f6b:
    (*mb->_vptr_ModelBin[2])(&local_198,mb,(ulong)(uint)this->group,1);
    piVar8 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
    if (&this->weight_data_int8_scales != &local_198) {
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + 1;
        UNLOCK();
      }
      piVar8 = (this->weight_data_int8_scales).refcount;
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          pAVar2 = (this->weight_data_int8_scales).allocator;
          if (pAVar2 == (Allocator *)0x0) {
            free((this->weight_data_int8_scales).data);
          }
          else {
            (*pAVar2->_vptr_Allocator[3])();
          }
        }
      }
      (this->weight_data_int8_scales).data = local_198.data;
      piVar8 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
      (this->weight_data_int8_scales).refcount = piVar8;
      (this->weight_data_int8_scales).elemsize =
           CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize);
      (this->weight_data_int8_scales).elempack = local_198.elempack;
      (this->weight_data_int8_scales).allocator = local_198.allocator;
      (this->weight_data_int8_scales).dims = local_198.dims;
      (this->weight_data_int8_scales).w = local_198.w;
      (this->weight_data_int8_scales).h = local_198.h;
      (this->weight_data_int8_scales).d = local_198.d;
      (this->weight_data_int8_scales).c = local_198.c;
      (this->weight_data_int8_scales).cstep = local_198.cstep;
    }
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        if (local_198.allocator == (Allocator *)0x0) {
          free(local_198.data);
        }
        else {
          (*(local_198.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    (*mb->_vptr_ModelBin[2])(&local_198,mb,1);
    piVar8 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
    if (&this->bottom_blob_int8_scales != &local_198) {
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + 1;
        UNLOCK();
      }
      piVar8 = (this->bottom_blob_int8_scales).refcount;
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          pAVar2 = (this->bottom_blob_int8_scales).allocator;
          if (pAVar2 == (Allocator *)0x0) {
            free((this->bottom_blob_int8_scales).data);
          }
          else {
            (*pAVar2->_vptr_Allocator[3])();
          }
        }
      }
      (this->bottom_blob_int8_scales).data = local_198.data;
      piVar8 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
      (this->bottom_blob_int8_scales).refcount = piVar8;
      (this->bottom_blob_int8_scales).elemsize =
           CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize);
      (this->bottom_blob_int8_scales).elempack = local_198.elempack;
      (this->bottom_blob_int8_scales).allocator = local_198.allocator;
      (this->bottom_blob_int8_scales).dims = local_198.dims;
      (this->bottom_blob_int8_scales).w = local_198.w;
      (this->bottom_blob_int8_scales).h = local_198.h;
      (this->bottom_blob_int8_scales).d = local_198.d;
      (this->bottom_blob_int8_scales).c = local_198.c;
      (this->bottom_blob_int8_scales).cstep = local_198.cstep;
    }
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        if (local_198.allocator == (Allocator *)0x0) {
          free(local_198.data);
        }
        else {
          (*(local_198.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    uVar1 = *(this->bottom_blob_int8_scales).data;
    local_198.cstep = 0;
    local_198.data = (void *)0x0;
    local_198.refcount._0_4_ = 0;
    local_198.refcount._4_4_ = 0;
    local_198.elemsize._0_4_ = 0;
    local_198.elemsize._4_4_ = 0;
    local_198.elempack = 0;
    local_198.allocator = (Allocator *)0x0;
    local_198.dims = 0;
    local_198.w = 0;
    local_198.h = 0;
    local_198.d = 0;
    local_198.c = 0;
    Mat::create(&local_198,this->group,4,(Allocator *)0x0);
    piVar8 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
    if (&this->bottom_blob_int8_scales != &local_198) {
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + 1;
        UNLOCK();
      }
      piVar8 = (this->bottom_blob_int8_scales).refcount;
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          pAVar2 = (this->bottom_blob_int8_scales).allocator;
          if (pAVar2 == (Allocator *)0x0) {
            free((this->bottom_blob_int8_scales).data);
          }
          else {
            (*pAVar2->_vptr_Allocator[3])();
          }
        }
      }
      (this->bottom_blob_int8_scales).data = local_198.data;
      piVar8 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
      (this->bottom_blob_int8_scales).refcount = piVar8;
      (this->bottom_blob_int8_scales).elemsize =
           CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize);
      (this->bottom_blob_int8_scales).elempack = local_198.elempack;
      (this->bottom_blob_int8_scales).allocator = local_198.allocator;
      (this->bottom_blob_int8_scales).dims = local_198.dims;
      (this->bottom_blob_int8_scales).w = local_198.w;
      (this->bottom_blob_int8_scales).h = local_198.h;
      (this->bottom_blob_int8_scales).d = local_198.d;
      (this->bottom_blob_int8_scales).c = local_198.c;
      (this->bottom_blob_int8_scales).cstep = local_198.cstep;
    }
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        if (local_198.allocator == (Allocator *)0x0) {
          free(local_198.data);
        }
        else {
          (*(local_198.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    uVar5 = (this->bottom_blob_int8_scales).c * (int)(this->bottom_blob_int8_scales).cstep;
    pvVar3 = (this->bottom_blob_int8_scales).data;
    uVar10 = 0;
    uVar9 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar9 = uVar10;
    }
    for (; (int)uVar9 != (int)uVar10; uVar10 = uVar10 + 1) {
      *(undefined4 *)((long)pvVar3 + uVar10 * 4) = uVar1;
    }
  }
  else {
    if ((iVar6 != 2) && (iVar6 != 0x66)) {
      if (iVar6 != 0x65) goto LAB_00398750;
      goto LAB_00397f6b;
    }
    (*mb->_vptr_ModelBin[2])(&local_198,mb,1);
    piVar8 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
    if (&this->weight_data_int8_scales != &local_198) {
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + 1;
        UNLOCK();
      }
      piVar8 = (this->weight_data_int8_scales).refcount;
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          pAVar2 = (this->weight_data_int8_scales).allocator;
          if (pAVar2 == (Allocator *)0x0) {
            free((this->weight_data_int8_scales).data);
          }
          else {
            (*pAVar2->_vptr_Allocator[3])();
          }
        }
      }
      (this->weight_data_int8_scales).data = local_198.data;
      piVar8 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
      (this->weight_data_int8_scales).refcount = piVar8;
      (this->weight_data_int8_scales).elemsize =
           CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize);
      (this->weight_data_int8_scales).elempack = local_198.elempack;
      (this->weight_data_int8_scales).allocator = local_198.allocator;
      (this->weight_data_int8_scales).dims = local_198.dims;
      (this->weight_data_int8_scales).w = local_198.w;
      (this->weight_data_int8_scales).h = local_198.h;
      (this->weight_data_int8_scales).d = local_198.d;
      (this->weight_data_int8_scales).c = local_198.c;
      (this->weight_data_int8_scales).cstep = local_198.cstep;
    }
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        if (local_198.allocator == (Allocator *)0x0) {
          free(local_198.data);
        }
        else {
          (*(local_198.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    (*mb->_vptr_ModelBin[2])(&local_198,mb,1);
    piVar8 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
    if (&this->bottom_blob_int8_scales != &local_198) {
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + 1;
        UNLOCK();
      }
      piVar8 = (this->bottom_blob_int8_scales).refcount;
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          pAVar2 = (this->bottom_blob_int8_scales).allocator;
          if (pAVar2 == (Allocator *)0x0) {
            free((this->bottom_blob_int8_scales).data);
          }
          else {
            (*pAVar2->_vptr_Allocator[3])();
          }
        }
      }
      (this->bottom_blob_int8_scales).data = local_198.data;
      piVar8 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
      (this->bottom_blob_int8_scales).refcount = piVar8;
      (this->bottom_blob_int8_scales).elemsize =
           CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize);
      (this->bottom_blob_int8_scales).elempack = local_198.elempack;
      (this->bottom_blob_int8_scales).allocator = local_198.allocator;
      (this->bottom_blob_int8_scales).dims = local_198.dims;
      (this->bottom_blob_int8_scales).w = local_198.w;
      (this->bottom_blob_int8_scales).h = local_198.h;
      (this->bottom_blob_int8_scales).d = local_198.d;
      (this->bottom_blob_int8_scales).c = local_198.c;
      (this->bottom_blob_int8_scales).cstep = local_198.cstep;
    }
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        if (local_198.allocator == (Allocator *)0x0) {
          free(local_198.data);
        }
        else {
          (*(local_198.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    uVar1 = *(this->weight_data_int8_scales).data;
    local_198.cstep = 0;
    local_198.data = (void *)0x0;
    local_198.refcount._0_4_ = 0;
    local_198.refcount._4_4_ = 0;
    local_198.elemsize._0_4_ = 0;
    local_198.elemsize._4_4_ = 0;
    local_198.elempack = 0;
    local_198.allocator = (Allocator *)0x0;
    local_198.dims = 0;
    local_198.w = 0;
    local_198.h = 0;
    local_198.d = 0;
    local_198.c = 0;
    Mat::create(&local_198,this->group,4,(Allocator *)0x0);
    piVar8 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
    if (&this->weight_data_int8_scales != &local_198) {
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + 1;
        UNLOCK();
      }
      piVar8 = (this->weight_data_int8_scales).refcount;
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          pAVar2 = (this->weight_data_int8_scales).allocator;
          if (pAVar2 == (Allocator *)0x0) {
            free((this->weight_data_int8_scales).data);
          }
          else {
            (*pAVar2->_vptr_Allocator[3])();
          }
        }
      }
      (this->weight_data_int8_scales).data = local_198.data;
      piVar8 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
      (this->weight_data_int8_scales).refcount = piVar8;
      (this->weight_data_int8_scales).elemsize =
           CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize);
      (this->weight_data_int8_scales).elempack = local_198.elempack;
      (this->weight_data_int8_scales).allocator = local_198.allocator;
      (this->weight_data_int8_scales).dims = local_198.dims;
      (this->weight_data_int8_scales).w = local_198.w;
      (this->weight_data_int8_scales).h = local_198.h;
      (this->weight_data_int8_scales).d = local_198.d;
      (this->weight_data_int8_scales).c = local_198.c;
      (this->weight_data_int8_scales).cstep = local_198.cstep;
    }
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        if (local_198.allocator == (Allocator *)0x0) {
          free(local_198.data);
        }
        else {
          (*(local_198.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    uVar5 = (this->weight_data_int8_scales).c * (int)(this->weight_data_int8_scales).cstep;
    pvVar3 = (this->weight_data_int8_scales).data;
    uVar10 = 0;
    uVar9 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar9 = uVar10;
    }
    for (; (int)uVar9 != (int)uVar10; uVar10 = uVar10 + 1) {
      *(undefined4 *)((long)pvVar3 + uVar10 * 4) = uVar1;
    }
    uVar1 = *(this->bottom_blob_int8_scales).data;
    local_198.cstep = 0;
    local_198.data = (void *)0x0;
    local_198.refcount._0_4_ = 0;
    local_198.refcount._4_4_ = 0;
    local_198.elemsize._0_4_ = 0;
    local_198.elemsize._4_4_ = 0;
    local_198.elempack = 0;
    local_198.allocator = (Allocator *)0x0;
    local_198.dims = 0;
    local_198.w = 0;
    local_198.h = 0;
    local_198.d = 0;
    local_198.c = 0;
    Mat::create(&local_198,this->group,4,(Allocator *)0x0);
    piVar8 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
    if (&this->bottom_blob_int8_scales != &local_198) {
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + 1;
        UNLOCK();
      }
      piVar8 = (this->bottom_blob_int8_scales).refcount;
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          pAVar2 = (this->bottom_blob_int8_scales).allocator;
          if (pAVar2 == (Allocator *)0x0) {
            free((this->bottom_blob_int8_scales).data);
          }
          else {
            (*pAVar2->_vptr_Allocator[3])();
          }
        }
      }
      (this->bottom_blob_int8_scales).data = local_198.data;
      piVar8 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
      (this->bottom_blob_int8_scales).refcount = piVar8;
      (this->bottom_blob_int8_scales).elemsize =
           CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize);
      (this->bottom_blob_int8_scales).elempack = local_198.elempack;
      (this->bottom_blob_int8_scales).allocator = local_198.allocator;
      (this->bottom_blob_int8_scales).dims = local_198.dims;
      (this->bottom_blob_int8_scales).w = local_198.w;
      (this->bottom_blob_int8_scales).h = local_198.h;
      (this->bottom_blob_int8_scales).d = local_198.d;
      (this->bottom_blob_int8_scales).c = local_198.c;
      (this->bottom_blob_int8_scales).cstep = local_198.cstep;
    }
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        if (local_198.allocator == (Allocator *)0x0) {
          free(local_198.data);
        }
        else {
          (*(local_198.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    uVar5 = (this->bottom_blob_int8_scales).c * (int)(this->bottom_blob_int8_scales).cstep;
    pvVar3 = (this->bottom_blob_int8_scales).data;
    uVar10 = 0;
    uVar9 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar9 = uVar10;
    }
    for (; (int)uVar9 != (int)uVar10; uVar10 = uVar10 + 1) {
      *(undefined4 *)((long)pvVar3 + uVar10 * 4) = uVar1;
    }
  }
  iVar6 = this->int8_scale_term;
LAB_00398750:
  if (100 < iVar6) {
    (*mb->_vptr_ModelBin[2])(&local_198,mb,1);
    piVar8 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
    if (&this->top_blob_int8_scales != &local_198) {
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + 1;
        UNLOCK();
      }
      piVar8 = (this->top_blob_int8_scales).refcount;
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          pAVar2 = (this->top_blob_int8_scales).allocator;
          if (pAVar2 == (Allocator *)0x0) {
            free((this->top_blob_int8_scales).data);
          }
          else {
            (*pAVar2->_vptr_Allocator[3])();
          }
        }
      }
      (this->top_blob_int8_scales).data = local_198.data;
      piVar8 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
      (this->top_blob_int8_scales).refcount = piVar8;
      (this->top_blob_int8_scales).elemsize =
           CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize);
      (this->top_blob_int8_scales).elempack = local_198.elempack;
      (this->top_blob_int8_scales).allocator = local_198.allocator;
      (this->top_blob_int8_scales).dims = local_198.dims;
      (this->top_blob_int8_scales).w = local_198.w;
      (this->top_blob_int8_scales).h = local_198.h;
      (this->top_blob_int8_scales).d = local_198.d;
      (this->top_blob_int8_scales).c = local_198.c;
      (this->top_blob_int8_scales).cstep = local_198.cstep;
    }
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        if (local_198.allocator == (Allocator *)0x0) {
          free(local_198.data);
        }
        else {
          (*(local_198.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    uVar1 = *(this->top_blob_int8_scales).data;
    local_198.cstep = 0;
    local_198.data = (void *)0x0;
    local_198.refcount._0_4_ = 0;
    local_198.refcount._4_4_ = 0;
    local_198.elemsize._0_4_ = 0;
    local_198.elemsize._4_4_ = 0;
    local_198.elempack = 0;
    local_198.allocator = (Allocator *)0x0;
    local_198.dims = 0;
    local_198.w = 0;
    local_198.h = 0;
    local_198.d = 0;
    local_198.c = 0;
    Mat::create(&local_198,this->group,4,(Allocator *)0x0);
    piVar8 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
    if (&this->top_blob_int8_scales != &local_198) {
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + 1;
        UNLOCK();
      }
      piVar8 = (this->top_blob_int8_scales).refcount;
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          pAVar2 = (this->top_blob_int8_scales).allocator;
          if (pAVar2 == (Allocator *)0x0) {
            free((this->top_blob_int8_scales).data);
          }
          else {
            (*pAVar2->_vptr_Allocator[3])();
          }
        }
      }
      (this->top_blob_int8_scales).data = local_198.data;
      piVar8 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
      (this->top_blob_int8_scales).refcount = piVar8;
      (this->top_blob_int8_scales).elemsize =
           CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize);
      (this->top_blob_int8_scales).elempack = local_198.elempack;
      (this->top_blob_int8_scales).allocator = local_198.allocator;
      (this->top_blob_int8_scales).dims = local_198.dims;
      (this->top_blob_int8_scales).w = local_198.w;
      (this->top_blob_int8_scales).h = local_198.h;
      (this->top_blob_int8_scales).d = local_198.d;
      (this->top_blob_int8_scales).c = local_198.c;
      (this->top_blob_int8_scales).cstep = local_198.cstep;
    }
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        if (local_198.allocator == (Allocator *)0x0) {
          free(local_198.data);
        }
        else {
          (*(local_198.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    uVar5 = (this->top_blob_int8_scales).c * (int)(this->top_blob_int8_scales).cstep;
    pvVar3 = (this->top_blob_int8_scales).data;
    uVar10 = 0;
    uVar9 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar9 = uVar10;
    }
    for (; (int)uVar9 != (int)uVar10; uVar10 = uVar10 + 1) {
      *(undefined4 *)((long)pvVar3 + uVar10 * 4) = uVar1;
    }
    iVar6 = this->int8_scale_term;
  }
  if (((this->weight_data).elemsize == 4) && (iVar6 != 0)) {
    local_198.cstep = 0;
    local_198.data = (void *)0x0;
    local_198.refcount._0_4_ = 0;
    local_198.refcount._4_4_ = 0;
    local_198.elemsize._0_4_ = 0;
    local_198.elemsize._4_4_ = 0;
    local_198.elempack = 0;
    local_198.allocator = (Allocator *)0x0;
    local_198.dims = 0;
    local_198.w = 0;
    local_198.h = 0;
    local_198.d = 0;
    local_198.c = 0;
    Mat::create(&local_198,this->weight_data_size,1,(Allocator *)0x0);
    bVar4 = true;
    if ((local_198.data != (void *)0x0) && ((long)local_198.c * local_198.cstep != 0)) {
      iVar6 = this->group;
      iVar7 = this->weight_data_size / iVar6;
      sVar13 = (size_t)iVar7;
      lVar11 = 0;
      for (lVar12 = 0; lVar12 < iVar6; lVar12 = lVar12 + 1) {
        Option::Option(&opt_q);
        local_148.dims = 1;
        opt_q.blob_allocator = local_198.allocator;
        opt_q.use_packing_layout = false;
        local_100.elemsize = (this->weight_data).elemsize;
        local_100.data = (void *)(local_100.elemsize * lVar11 + (long)(this->weight_data).data);
        local_100.elempack = (this->weight_data).elempack;
        local_100.allocator = (this->weight_data).allocator;
        local_100.refcount = (int *)0x0;
        local_100.h = 1;
        local_100.d = 1;
        local_148.elemsize = CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize);
        local_148.data = (void *)(local_148.elemsize * lVar11 + (long)local_198.data);
        local_148.refcount = (int *)0x0;
        local_148.elempack = local_198.elempack;
        local_148.allocator = local_198.allocator;
        local_148.h = 1;
        local_148.d = 1;
        local_b8.elemsize = (this->weight_data_int8_scales).elemsize;
        local_b8.data =
             (void *)(local_b8.elemsize * lVar12 + (long)(this->weight_data_int8_scales).data);
        local_b8.elempack = (this->weight_data_int8_scales).elempack;
        local_b8.allocator = (this->weight_data_int8_scales).allocator;
        local_b8.refcount = (int *)0x0;
        local_b8.dims = 1;
        local_b8.w = 1;
        local_b8.h = 1;
        local_b8.d = 1;
        local_b8.cstep = 1;
        local_148.w = iVar7;
        local_148.c = local_148.dims;
        local_148.cstep = sVar13;
        local_100.dims = local_148.dims;
        local_100.w = iVar7;
        local_100.c = local_148.dims;
        local_100.cstep = sVar13;
        local_b8.c = local_148.dims;
        opt_q.num_threads = local_148.dims;
        quantize_to_int8(&local_100,&local_148,&local_b8,&opt_q);
        if (local_b8.refcount != (int *)0x0) {
          LOCK();
          *local_b8.refcount = *local_b8.refcount + -1;
          UNLOCK();
          if (*local_b8.refcount == 0) {
            if (local_b8.allocator == (Allocator *)0x0) {
              free(local_b8.data);
            }
            else {
              (*(local_b8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if (local_148.refcount != (int *)0x0) {
          LOCK();
          *local_148.refcount = *local_148.refcount + -1;
          UNLOCK();
          if (*local_148.refcount == 0) {
            if (local_148.allocator == (Allocator *)0x0) {
              free(local_148.data);
            }
            else {
              (*(local_148.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if (local_100.refcount != (int *)0x0) {
          LOCK();
          *local_100.refcount = *local_100.refcount + -1;
          UNLOCK();
          if (*local_100.refcount == 0) {
            if (local_100.allocator == (Allocator *)0x0) {
              free(local_100.data);
            }
            else {
              (*(local_100.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar6 = this->group;
        lVar11 = lVar11 + sVar13;
      }
      if (local_150 != &local_198) {
        piVar8 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + 1;
          UNLOCK();
        }
        piVar8 = (this->weight_data).refcount;
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            pAVar2 = (this->weight_data).allocator;
            if (pAVar2 == (Allocator *)0x0) {
              free((this->weight_data).data);
            }
            else {
              (*pAVar2->_vptr_Allocator[3])();
            }
          }
        }
        (this->weight_data).data = local_198.data;
        (this->weight_data).refcount =
             (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
        (this->weight_data).elemsize =
             CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize);
        (this->weight_data).elempack = local_198.elempack;
        (this->weight_data).allocator = local_198.allocator;
        (this->weight_data).dims = local_198.dims;
        (this->weight_data).w = local_198.w;
        (this->weight_data).h = local_198.h;
        (this->weight_data).d = local_198.d;
        (this->weight_data).c = local_198.c;
        (this->weight_data).cstep = local_198.cstep;
      }
      bVar4 = false;
    }
    piVar8 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        if (local_198.allocator == (Allocator *)0x0) {
          free(local_198.data);
        }
        else {
          (*(local_198.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (bVar4) {
      return -100;
    }
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise::load_model(const ModelBin& mb)
{
    if (dynamic_weight)
        return 0;

    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

#if NCNN_INT8
    if (int8_scale_term == 1 || int8_scale_term == 101)
    {
        weight_data_int8_scales = mb.load(group, 1);
        bottom_blob_int8_scales = mb.load(1, 1);

        float bottom_blob_int8_scale = bottom_blob_int8_scales[0];
        bottom_blob_int8_scales = Mat(group);
        bottom_blob_int8_scales.fill(bottom_blob_int8_scale);
    }
    else if (int8_scale_term == 2 || int8_scale_term == 102)
    {
        weight_data_int8_scales = mb.load(1, 1);
        bottom_blob_int8_scales = mb.load(1, 1);

        // extend group if only one provided
        float weight_data_int8_scale = weight_data_int8_scales[0];
        weight_data_int8_scales = Mat(group);
        weight_data_int8_scales.fill(weight_data_int8_scale);

        float bottom_blob_int8_scale = bottom_blob_int8_scales[0];
        bottom_blob_int8_scales = Mat(group);
        bottom_blob_int8_scales.fill(bottom_blob_int8_scale);
    }

    if (int8_scale_term > 100)
    {
        top_blob_int8_scales = mb.load(1, 1);

        float top_blob_int8_scale = top_blob_int8_scales[0];
        top_blob_int8_scales = Mat(group);
        top_blob_int8_scales.fill(top_blob_int8_scale);
    }
#endif // NCNN_INT8

#if NCNN_INT8
    // runtime quantize the weight data
    if (weight_data.elemsize == (size_t)4u && int8_scale_term)
    {
        Mat int8_weight_data(weight_data_size, (size_t)1u);
        if (int8_weight_data.empty())
            return -100;

        const int weight_data_size_g = weight_data_size / group;

        for (int g = 0; g < group; g++)
        {
            Option opt_q;
            opt_q.num_threads = 1;
            opt_q.blob_allocator = int8_weight_data.allocator;
            opt_q.use_packing_layout = false;

            const Mat weight_data_g = weight_data.range(weight_data_size_g * g, weight_data_size_g);
            Mat int8_weight_data_g = int8_weight_data.range(weight_data_size_g * g, weight_data_size_g);
            const Mat weight_data_int8_scales_g = weight_data_int8_scales.range(g, 1);
            quantize_to_int8(weight_data_g, int8_weight_data_g, weight_data_int8_scales_g, opt_q);
        }

        weight_data = int8_weight_data;
    }
#endif // NCNN_INT8

    return 0;
}